

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_linear_resampler_set_rate_internal
                    (ma_linear_resampler *pResampler,void *pHeap,
                    ma_linear_resampler_heap_layout *pHeapLayout,ma_uint32 sampleRateIn,
                    ma_uint32 sampleRateOut,ma_bool32 isResamplerAlreadyInitialized)

{
  uint uVar1;
  uint uVar2;
  ma_result mVar3;
  uint uVar4;
  ulong uVar5;
  ma_uint32 mVar6;
  void *pHeap_00;
  ulong uVar7;
  ma_lpf_config local_38;
  
  mVar3 = MA_INVALID_ARGS;
  if ((pResampler != (ma_linear_resampler *)0x0) && (sampleRateOut != 0 && sampleRateIn != 0)) {
    uVar4 = (pResampler->config).sampleRateOut;
    uVar5 = (ulong)sampleRateIn;
    mVar6 = sampleRateOut;
    do {
      uVar1 = mVar6;
      uVar7 = (ulong)uVar1;
      mVar6 = (ma_uint32)(uVar5 % uVar7);
      uVar5 = uVar7;
    } while (mVar6 != 0);
    uVar5 = (ulong)sampleRateIn / (ulong)uVar1;
    uVar1 = (uint)uVar5;
    (pResampler->config).sampleRateIn = uVar1;
    uVar2 = (uint)(sampleRateOut / uVar7);
    (pResampler->config).sampleRateOut = uVar2;
    local_38.order = (pResampler->config).lpfOrder;
    if (local_38.order < 9) {
      local_38.sampleRate = uVar2;
      if (uVar1 >= uVar2 && uVar1 != uVar2) {
        local_38.sampleRate = uVar1;
      }
      uVar7 = sampleRateOut / uVar7;
      if (uVar1 < uVar2) {
        uVar7 = uVar5;
      }
      local_38.cutoffFrequency = (double)uVar7 * 0.5 * (pResampler->config).lpfNyquistFactor;
      local_38.format = (pResampler->config).format;
      local_38.channels = (pResampler->config).channels;
      local_38._12_4_ = 0;
      local_38._28_4_ = 0;
      if (isResamplerAlreadyInitialized == 0) {
        pHeap_00 = (void *)((long)pHeap + pHeapLayout->lpfOffset);
        (pResampler->lpf).pLPF2 = (ma_lpf2 *)0x0;
        (pResampler->lpf)._pHeap = (void *)0x0;
        *(undefined8 *)&(pResampler->lpf).lpf2Count = 0;
        (pResampler->lpf).pLPF1 = (ma_lpf1 *)0x0;
        (pResampler->lpf).format = ma_format_unknown;
        (pResampler->lpf).channels = 0;
        (pResampler->lpf).sampleRate = 0;
        (pResampler->lpf).lpf1Count = 0;
        *(undefined8 *)&(pResampler->lpf)._ownsHeap = 0;
      }
      else {
        pHeap_00 = (void *)0x0;
      }
      mVar3 = ma_lpf_reinit__internal
                        (&local_38,pHeap_00,&pResampler->lpf,
                         (uint)(isResamplerAlreadyInitialized == 0));
      if (mVar3 == MA_SUCCESS) {
        uVar1 = (pResampler->config).sampleRateIn;
        uVar2 = (pResampler->config).sampleRateOut;
        pResampler->inAdvanceInt = uVar1 / uVar2;
        pResampler->inAdvanceFrac = uVar1 % uVar2;
        uVar4 = ((pResampler->inTimeFrac % uVar4) * uVar2) / uVar4 +
                (pResampler->inTimeFrac / uVar4) * uVar2;
        pResampler->inTimeInt = pResampler->inTimeInt + uVar4 / uVar2;
        mVar3 = MA_SUCCESS;
        pResampler->inTimeFrac = uVar4 % uVar2;
      }
    }
  }
  return mVar3;
}

Assistant:

static ma_result ma_linear_resampler_set_rate_internal(ma_linear_resampler* pResampler, void* pHeap, ma_linear_resampler_heap_layout* pHeapLayout, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut, ma_bool32 isResamplerAlreadyInitialized)
{
    ma_result result;
    ma_uint32 gcf;
    ma_uint32 lpfSampleRate;
    double lpfCutoffFrequency;
    ma_lpf_config lpfConfig;
    ma_uint32 oldSampleRateOut; /* Required for adjusting time advance down the bottom. */

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (sampleRateIn == 0 || sampleRateOut == 0) {
        return MA_INVALID_ARGS;
    }

    oldSampleRateOut = pResampler->config.sampleRateOut;

    pResampler->config.sampleRateIn  = sampleRateIn;
    pResampler->config.sampleRateOut = sampleRateOut;

    /* Simplify the sample rate. */
    gcf = ma_gcf_u32(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut);
    pResampler->config.sampleRateIn  /= gcf;
    pResampler->config.sampleRateOut /= gcf;

    /* Always initialize the low-pass filter, even when the order is 0. */
    if (pResampler->config.lpfOrder > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    lpfSampleRate      = (ma_uint32)(ma_max(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut));
    lpfCutoffFrequency = (   double)(ma_min(pResampler->config.sampleRateIn, pResampler->config.sampleRateOut) * 0.5 * pResampler->config.lpfNyquistFactor);

    lpfConfig = ma_lpf_config_init(pResampler->config.format, pResampler->config.channels, lpfSampleRate, lpfCutoffFrequency, pResampler->config.lpfOrder);

    /*
    If the resampler is alreay initialized we don't want to do a fresh initialization of the low-pass filter because it will result in the cached frames
    getting cleared. Instead we re-initialize the filter which will maintain any cached frames.
    */
    if (isResamplerAlreadyInitialized) {
        result = ma_lpf_reinit(&lpfConfig, &pResampler->lpf);
    } else {
        result = ma_lpf_init_preallocated(&lpfConfig, ma_offset_ptr(pHeap, pHeapLayout->lpfOffset), &pResampler->lpf);
    }

    if (result != MA_SUCCESS) {
        return result;
    }


    pResampler->inAdvanceInt  = pResampler->config.sampleRateIn / pResampler->config.sampleRateOut;
    pResampler->inAdvanceFrac = pResampler->config.sampleRateIn % pResampler->config.sampleRateOut;

    /* Our timer was based on the old rate. We need to adjust it so that it's based on the new rate. */
    ma_linear_resampler_adjust_timer_for_new_rate(pResampler, oldSampleRateOut, pResampler->config.sampleRateOut);

    return MA_SUCCESS;
}